

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int get_pred_context_brfarf2_or_arf(MACROBLOCKD *xd)

{
  uint uVar1;
  int local_20;
  int pred_context;
  int arf_count;
  int brfarf2_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  uVar1 = (uint)xd->neighbors_ref_counts[5] + (uint)xd->neighbors_ref_counts[6];
  if (uVar1 == xd->neighbors_ref_counts[7]) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (uVar1 < xd->neighbors_ref_counts[7]) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

static int get_pred_context_brfarf2_or_arf(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Counts of BWDREF, ALTREF2, or ALTREF frames (B, A2, or A)
  const int brfarf2_count =
      ref_counts[BWDREF_FRAME] + ref_counts[ALTREF2_FRAME];
  const int arf_count = ref_counts[ALTREF_FRAME];

  const int pred_context =
      (brfarf2_count == arf_count) ? 1 : ((brfarf2_count < arf_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}